

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  int *piVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  U32 *pUVar10;
  BYTE *pBVar11;
  char cVar12;
  uint uVar13;
  BYTE *op_1;
  ulong uVar14;
  BYTE *pBVar15;
  seqDef *psVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  U32 UVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  long *plVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  long *plVar28;
  ulong uVar29;
  ulong *puVar30;
  long *plVar31;
  BYTE *pInLoopLimit;
  BYTE *pBVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long *plVar36;
  U32 *hashTable;
  BYTE *base;
  BYTE *iend;
  BYTE *ilimit;
  BYTE *lowest;
  U32 lowestIndex;
  
  uVar27 = cParams->searchLength;
  uVar19 = (ulong)cParams->targetLength;
  pUVar10 = ms->hashTable;
  pBVar11 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  pBVar32 = pBVar11 + uVar7;
  uVar8 = rep[1];
  plVar28 = (long *)((ulong)(pBVar32 == (BYTE *)src) + (long)src);
  uVar18 = (int)plVar28 - (int)pBVar32;
  uVar25 = 0;
  uVar22 = (ulong)uVar8;
  if (uVar18 < uVar8) {
    uVar22 = uVar25;
  }
  uVar13 = (uint)uVar22;
  puVar2 = (ulong *)((long)src + srcSize);
  plVar36 = (long *)((long)src + (srcSize - 8));
  uVar9 = *rep;
  if (uVar9 <= uVar18) {
    uVar25 = (ulong)uVar9;
  }
  uVar26 = (uint)uVar25;
  iVar34 = (int)pBVar11;
  cVar12 = (char)cParams->hashLog;
  if (uVar27 == 5) {
    if (plVar28 < plVar36) {
      bVar17 = 0x40 - cVar12;
      puVar4 = (ulong *)((long)puVar2 - 7);
      puVar5 = (ulong *)((long)puVar2 - 3);
      puVar6 = (ulong *)((long)puVar2 - 1);
      do {
        uVar14 = (ulong)(*plVar28 * -0x30e4432345000000) >> (bVar17 & 0x3f);
        uVar21 = (long)plVar28 - (long)pBVar11;
        uVar27 = pUVar10[uVar14];
        uVar29 = (ulong)uVar27;
        UVar20 = (U32)uVar21;
        pUVar10[uVar14] = UVar20;
        if (((int)uVar25 == 0) ||
           (plVar31 = (long *)((long)plVar28 + 1),
           *(int *)((long)plVar31 - uVar25) != *(int *)((long)plVar28 + 1))) {
          if ((uVar7 < uVar27) && (piVar3 = (int *)(pBVar11 + uVar29), *piVar3 == (int)*plVar28)) {
            puVar1 = (ulong *)((long)plVar28 + 4);
            puVar23 = (ulong *)(piVar3 + 1);
            puVar30 = puVar1;
            if (puVar1 < puVar4) {
              if (*puVar23 == *puVar1) {
                lVar33 = 0;
                do {
                  puVar23 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                  if (puVar4 <= puVar23) {
                    puVar23 = (ulong *)(pBVar11 + lVar33 + uVar29 + 0xc);
                    puVar30 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                    goto LAB_00190bf8;
                  }
                  lVar35 = lVar33 + uVar29 + 0xc;
                  uVar22 = *puVar23;
                  lVar33 = lVar33 + 8;
                } while (*(ulong *)(pBVar11 + lVar35) == uVar22);
                uVar22 = uVar22 ^ *(ulong *)(pBVar11 + lVar35);
                uVar14 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar22 = (uVar14 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar14 = *puVar1 ^ *puVar23;
                uVar22 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00190bf8:
              if ((puVar30 < puVar5) && ((int)*puVar23 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar30 < puVar6) && ((short)*puVar23 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar30 < puVar2) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar23 == (char)*puVar30));
              }
              uVar22 = (long)puVar30 - (long)puVar1;
            }
            lVar33 = uVar22 + 4;
            plVar31 = plVar28;
            if (src < plVar28) {
              pBVar15 = pBVar11 + (uVar29 - 1);
              do {
                plVar24 = (long *)((long)plVar31 + -1);
                if ((*(BYTE *)plVar24 != *pBVar15) ||
                   (lVar33 = lVar33 + 1, plVar31 = plVar24, pBVar15 <= pBVar32)) break;
                pBVar15 = pBVar15 + -1;
              } while (src < plVar24);
            }
            uVar27 = (int)plVar28 - (int)piVar3;
            uVar22 = (long)plVar31 - (long)src;
            plVar24 = (long *)seqStore->lit;
            plVar28 = (long *)((long)plVar24 + uVar22);
            do {
              *plVar24 = *src;
              plVar24 = plVar24 + 1;
              src = (void *)((long)src + 8);
            } while (plVar24 < plVar28);
            seqStore->lit = seqStore->lit + uVar22;
            if (uVar22 < 0x10000) {
              psVar16 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar16 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar14 = lVar33 - 3;
            psVar16->litLength = (U16)uVar22;
            psVar16->offset = uVar27 + 3;
            uVar22 = uVar25;
            uVar25 = (ulong)uVar27;
            goto joined_r0x00190cf5;
          }
          plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar19);
        }
        else {
          lVar33 = -uVar25;
          puVar1 = (ulong *)((long)plVar28 + 5);
          puVar30 = (ulong *)((long)plVar28 + lVar33 + 5);
          puVar23 = puVar1;
          if (puVar1 < puVar4) {
            if (*puVar30 == *puVar1) {
              lVar35 = 0;
              do {
                puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                if (puVar4 <= puVar23) {
                  puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xd);
                  puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                  goto LAB_001908f6;
                }
                uVar14 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xd);
                uVar29 = *puVar23;
                lVar35 = lVar35 + 8;
              } while (uVar14 == uVar29);
              uVar29 = uVar29 ^ uVar14;
              uVar14 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar35;
            }
            else {
              uVar29 = *puVar1 ^ *puVar30;
              uVar14 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001908f6:
            if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar30 = (ulong *)((long)puVar30 + 4);
            }
            if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar30 = (ulong *)((long)puVar30 + 2);
            }
            if (puVar23 < puVar2) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
            }
            uVar14 = (long)puVar23 - (long)puVar1;
          }
          uVar29 = (long)plVar31 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar28 = (long *)((long)plVar24 + uVar29);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar28);
          seqStore->lit = seqStore->lit + uVar29;
          if (uVar29 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar33 = uVar14 + 4;
          uVar14 = uVar14 + 1;
          psVar16->litLength = (U16)uVar29;
          psVar16->offset = 1;
joined_r0x00190cf5:
          if (0xffff < uVar14) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar28 = (long *)(lVar33 + (long)plVar31);
          psVar16->matchLength = (U16)uVar14;
          seqStore->sequences = psVar16 + 1;
          src = plVar28;
          if (plVar28 <= plVar36) {
            pUVar10[(ulong)(*(long *)(pBVar11 + (uVar21 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar17 & 0x3f)] = UVar20 + 2;
            pUVar10[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e4432345000000) >> (bVar17 & 0x3f)]
                 = ((int)plVar28 + -2) - iVar34;
            do {
              uVar14 = uVar22;
              uVar22 = uVar14;
              src = plVar28;
              if (((int)uVar14 == 0) || ((int)*plVar28 != *(int *)((long)plVar28 - uVar14))) break;
              lVar33 = -uVar14;
              puVar1 = (ulong *)((long)plVar28 + 4);
              puVar30 = (ulong *)((long)plVar28 + lVar33 + 4);
              puVar23 = puVar1;
              if (puVar1 < puVar4) {
                if (*puVar30 == *puVar1) {
                  lVar35 = 0;
                  do {
                    puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                    if (puVar4 <= puVar23) {
                      puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xc);
                      puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                      goto LAB_00190afc;
                    }
                    uVar22 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xc);
                    uVar21 = *puVar23;
                    lVar35 = lVar35 + 8;
                  } while (uVar22 == uVar21);
                  uVar21 = uVar21 ^ uVar22;
                  uVar22 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar35;
                }
                else {
                  uVar21 = *puVar1 ^ *puVar30;
                  uVar22 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00190afc:
                if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar23 < puVar2) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
                }
                uVar22 = (long)puVar23 - (long)puVar1;
              }
              pUVar10[(ulong)(*plVar28 * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
                   (int)plVar28 - iVar34;
              *(long *)seqStore->lit = *plVar28;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < uVar22 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(uVar22 + 1);
              seqStore->sequences = psVar16 + 1;
              plVar28 = (long *)((long)plVar28 + uVar22 + 4);
              uVar22 = uVar25;
              uVar25 = uVar14;
              src = plVar28;
            } while (plVar28 <= plVar36);
          }
        }
        uVar13 = (uint)uVar22;
        uVar26 = (uint)uVar25;
      } while (plVar28 < plVar36);
    }
  }
  else if (uVar27 == 6) {
    if (plVar28 < plVar36) {
      bVar17 = 0x40 - cVar12;
      puVar4 = (ulong *)((long)puVar2 - 7);
      puVar5 = (ulong *)((long)puVar2 - 3);
      puVar6 = (ulong *)((long)puVar2 - 1);
      do {
        uVar14 = (ulong)(*plVar28 * -0x30e4432340650000) >> (bVar17 & 0x3f);
        uVar21 = (long)plVar28 - (long)pBVar11;
        uVar27 = pUVar10[uVar14];
        uVar29 = (ulong)uVar27;
        UVar20 = (U32)uVar21;
        pUVar10[uVar14] = UVar20;
        if (((int)uVar25 == 0) ||
           (plVar31 = (long *)((long)plVar28 + 1),
           *(int *)((long)plVar31 - uVar25) != *(int *)((long)plVar28 + 1))) {
          if ((uVar7 < uVar27) && (piVar3 = (int *)(pBVar11 + uVar29), *piVar3 == (int)*plVar28)) {
            puVar1 = (ulong *)((long)plVar28 + 4);
            puVar23 = (ulong *)(piVar3 + 1);
            puVar30 = puVar1;
            if (puVar1 < puVar4) {
              if (*puVar23 == *puVar1) {
                lVar33 = 0;
                do {
                  puVar23 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                  if (puVar4 <= puVar23) {
                    puVar23 = (ulong *)(pBVar11 + lVar33 + uVar29 + 0xc);
                    puVar30 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                    goto LAB_0019062b;
                  }
                  lVar35 = lVar33 + uVar29 + 0xc;
                  uVar22 = *puVar23;
                  lVar33 = lVar33 + 8;
                } while (*(ulong *)(pBVar11 + lVar35) == uVar22);
                uVar22 = uVar22 ^ *(ulong *)(pBVar11 + lVar35);
                uVar14 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar22 = (uVar14 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar14 = *puVar1 ^ *puVar23;
                uVar22 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0019062b:
              if ((puVar30 < puVar5) && ((int)*puVar23 == (int)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 4);
                puVar23 = (ulong *)((long)puVar23 + 4);
              }
              if ((puVar30 < puVar6) && ((short)*puVar23 == (short)*puVar30)) {
                puVar30 = (ulong *)((long)puVar30 + 2);
                puVar23 = (ulong *)((long)puVar23 + 2);
              }
              if (puVar30 < puVar2) {
                puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar23 == (char)*puVar30));
              }
              uVar22 = (long)puVar30 - (long)puVar1;
            }
            lVar33 = uVar22 + 4;
            plVar31 = plVar28;
            if (src < plVar28) {
              pBVar15 = pBVar11 + (uVar29 - 1);
              do {
                plVar24 = (long *)((long)plVar31 + -1);
                if ((*(BYTE *)plVar24 != *pBVar15) ||
                   (lVar33 = lVar33 + 1, plVar31 = plVar24, pBVar15 <= pBVar32)) break;
                pBVar15 = pBVar15 + -1;
              } while (src < plVar24);
            }
            hashTable._0_4_ = (int)piVar3;
            uVar27 = (int)plVar28 - (int)hashTable;
            uVar22 = (long)plVar31 - (long)src;
            plVar24 = (long *)seqStore->lit;
            plVar28 = (long *)((long)plVar24 + uVar22);
            do {
              *plVar24 = *src;
              plVar24 = plVar24 + 1;
              src = (void *)((long)src + 8);
            } while (plVar24 < plVar28);
            seqStore->lit = seqStore->lit + uVar22;
            if (uVar22 < 0x10000) {
              psVar16 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar16 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar14 = lVar33 - 3;
            psVar16->litLength = (U16)uVar22;
            psVar16->offset = uVar27 + 3;
            uVar22 = uVar25;
            uVar25 = (ulong)uVar27;
            goto joined_r0x0019071b;
          }
          plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar19);
        }
        else {
          lVar33 = -uVar25;
          puVar1 = (ulong *)((long)plVar28 + 5);
          puVar30 = (ulong *)((long)plVar28 + lVar33 + 5);
          puVar23 = puVar1;
          if (puVar1 < puVar4) {
            if (*puVar30 == *puVar1) {
              lVar35 = 0;
              do {
                puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                if (puVar4 <= puVar23) {
                  puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xd);
                  puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                  goto LAB_00190337;
                }
                uVar14 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xd);
                uVar29 = *puVar23;
                lVar35 = lVar35 + 8;
              } while (uVar14 == uVar29);
              uVar29 = uVar29 ^ uVar14;
              uVar14 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar35;
            }
            else {
              uVar29 = *puVar1 ^ *puVar30;
              uVar14 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00190337:
            if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar30 = (ulong *)((long)puVar30 + 4);
            }
            if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar30 = (ulong *)((long)puVar30 + 2);
            }
            if (puVar23 < puVar2) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
            }
            uVar14 = (long)puVar23 - (long)puVar1;
          }
          uVar29 = (long)plVar31 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar28 = (long *)((long)plVar24 + uVar29);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar28);
          seqStore->lit = seqStore->lit + uVar29;
          if (uVar29 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar33 = uVar14 + 4;
          uVar14 = uVar14 + 1;
          psVar16->litLength = (U16)uVar29;
          psVar16->offset = 1;
joined_r0x0019071b:
          if (0xffff < uVar14) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar28 = (long *)(lVar33 + (long)plVar31);
          psVar16->matchLength = (U16)uVar14;
          seqStore->sequences = psVar16 + 1;
          src = plVar28;
          if (plVar28 <= plVar36) {
            pUVar10[(ulong)(*(long *)(pBVar11 + (uVar21 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar17 & 0x3f)] = UVar20 + 2;
            pUVar10[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e4432340650000) >> (bVar17 & 0x3f)]
                 = ((int)plVar28 + -2) - iVar34;
            do {
              uVar14 = uVar25;
              uVar25 = uVar14;
              src = plVar28;
              if (((int)uVar22 == 0) || ((int)*plVar28 != *(int *)((long)plVar28 - uVar22))) break;
              lVar33 = -uVar22;
              puVar1 = (ulong *)((long)plVar28 + 4);
              puVar30 = (ulong *)((long)plVar28 + lVar33 + 4);
              puVar23 = puVar1;
              if (puVar1 < puVar4) {
                if (*puVar30 == *puVar1) {
                  lVar35 = 0;
                  do {
                    puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                    if (puVar4 <= puVar23) {
                      puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xc);
                      puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                      goto LAB_0019052a;
                    }
                    uVar25 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xc);
                    uVar21 = *puVar23;
                    lVar35 = lVar35 + 8;
                  } while (uVar25 == uVar21);
                  uVar21 = uVar21 ^ uVar25;
                  uVar25 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar35;
                }
                else {
                  uVar21 = *puVar1 ^ *puVar30;
                  uVar25 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar25 = uVar25 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0019052a:
                if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar23 < puVar2) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
                }
                uVar25 = (long)puVar23 - (long)puVar1;
              }
              pUVar10[(ulong)(*plVar28 * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
                   (int)plVar28 - iVar34;
              *(long *)seqStore->lit = *plVar28;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < uVar25 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(uVar25 + 1);
              seqStore->sequences = psVar16 + 1;
              plVar28 = (long *)((long)plVar28 + uVar25 + 4);
              uVar25 = uVar22;
              uVar22 = uVar14;
              src = plVar28;
            } while (plVar28 <= plVar36);
          }
        }
        uVar13 = (uint)uVar22;
        uVar26 = (uint)uVar25;
      } while (plVar28 < plVar36);
    }
  }
  else if (uVar27 == 7) {
    if (plVar28 < plVar36) {
      bVar17 = 0x40 - cVar12;
      puVar4 = (ulong *)((long)puVar2 - 7);
      puVar5 = (ulong *)((long)puVar2 - 3);
      puVar6 = (ulong *)((long)puVar2 - 1);
      do {
        uVar29 = (ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar17 & 0x3f);
        uVar21 = (long)plVar28 - (long)pBVar11;
        uVar27 = pUVar10[uVar29];
        uVar14 = (ulong)uVar27;
        UVar20 = (U32)uVar21;
        pUVar10[uVar29] = UVar20;
        if (((int)uVar25 == 0) ||
           (plVar31 = (long *)((long)plVar28 + 1),
           *(int *)((long)plVar31 - uVar25) != *(int *)((long)plVar28 + 1))) {
          if ((uVar7 < uVar27) && (piVar3 = (int *)(pBVar11 + uVar14), *piVar3 == (int)*plVar28)) {
            puVar1 = (ulong *)((long)plVar28 + 4);
            puVar30 = (ulong *)(piVar3 + 1);
            puVar23 = puVar1;
            if (puVar1 < puVar4) {
              if (*puVar30 == *puVar1) {
                lVar33 = 0;
                do {
                  puVar23 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                  if (puVar4 <= puVar23) {
                    puVar30 = (ulong *)(pBVar11 + lVar33 + uVar14 + 0xc);
                    puVar23 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                    goto LAB_0019005e;
                  }
                  lVar35 = lVar33 + uVar14 + 0xc;
                  uVar22 = *puVar23;
                  lVar33 = lVar33 + 8;
                } while (*(ulong *)(pBVar11 + lVar35) == uVar22);
                uVar22 = uVar22 ^ *(ulong *)(pBVar11 + lVar35);
                uVar29 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                  }
                }
                uVar22 = (uVar29 >> 3 & 0x1fffffff) + lVar33;
              }
              else {
                uVar29 = *puVar1 ^ *puVar30;
                uVar22 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0019005e:
              if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar23 < puVar2) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
              }
              uVar22 = (long)puVar23 - (long)puVar1;
            }
            lVar33 = uVar22 + 4;
            plVar31 = plVar28;
            if (src < plVar28) {
              pBVar15 = pBVar11 + (uVar14 - 1);
              do {
                plVar24 = (long *)((long)plVar31 + -1);
                if ((*(BYTE *)plVar24 != *pBVar15) ||
                   (lVar33 = lVar33 + 1, plVar31 = plVar24, pBVar15 <= pBVar32)) break;
                pBVar15 = pBVar15 + -1;
              } while (src < plVar24);
            }
            uVar27 = (int)plVar28 - (int)piVar3;
            uVar22 = (long)plVar31 - (long)src;
            plVar24 = (long *)seqStore->lit;
            plVar28 = (long *)((long)plVar24 + uVar22);
            do {
              *plVar24 = *src;
              plVar24 = plVar24 + 1;
              src = (void *)((long)src + 8);
            } while (plVar24 < plVar28);
            seqStore->lit = seqStore->lit + uVar22;
            if (uVar22 < 0x10000) {
              psVar16 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar16 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar14 = lVar33 - 3;
            psVar16->litLength = (U16)uVar22;
            psVar16->offset = uVar27 + 3;
            uVar22 = uVar25;
            uVar25 = (ulong)uVar27;
            goto joined_r0x00190157;
          }
          plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar19);
        }
        else {
          lVar33 = -uVar25;
          puVar1 = (ulong *)((long)plVar28 + 5);
          puVar30 = (ulong *)((long)plVar28 + lVar33 + 5);
          puVar23 = puVar1;
          if (puVar1 < puVar4) {
            if (*puVar30 == *puVar1) {
              lVar35 = 0;
              do {
                puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                if (puVar4 <= puVar23) {
                  puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xd);
                  puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                  goto LAB_0018fd5e;
                }
                uVar14 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xd);
                uVar29 = *puVar23;
                lVar35 = lVar35 + 8;
              } while (uVar14 == uVar29);
              uVar29 = uVar29 ^ uVar14;
              uVar14 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar35;
            }
            else {
              uVar29 = *puVar1 ^ *puVar30;
              uVar14 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0018fd5e:
            if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar30 = (ulong *)((long)puVar30 + 4);
            }
            if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar30 = (ulong *)((long)puVar30 + 2);
            }
            if (puVar23 < puVar2) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
            }
            uVar14 = (long)puVar23 - (long)puVar1;
          }
          uVar29 = (long)plVar31 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar28 = (long *)((long)plVar24 + uVar29);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar28);
          seqStore->lit = seqStore->lit + uVar29;
          if (uVar29 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar33 = uVar14 + 4;
          uVar14 = uVar14 + 1;
          psVar16->litLength = (U16)uVar29;
          psVar16->offset = 1;
joined_r0x00190157:
          if (0xffff < uVar14) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          plVar28 = (long *)(lVar33 + (long)plVar31);
          psVar16->matchLength = (U16)uVar14;
          seqStore->sequences = psVar16 + 1;
          src = plVar28;
          if (plVar28 <= plVar36) {
            pUVar10[(ulong)(*(long *)(pBVar11 + (uVar21 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar17 & 0x3f)] = UVar20 + 2;
            pUVar10[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)]
                 = ((int)plVar28 + -2) - iVar34;
            do {
              uVar14 = uVar22;
              uVar22 = uVar14;
              src = plVar28;
              if (((int)uVar14 == 0) || ((int)*plVar28 != *(int *)((long)plVar28 - uVar14))) break;
              lVar33 = -uVar14;
              puVar1 = (ulong *)((long)plVar28 + 4);
              puVar30 = (ulong *)((long)plVar28 + lVar33 + 4);
              puVar23 = puVar1;
              if (puVar1 < puVar4) {
                if (*puVar30 == *puVar1) {
                  lVar35 = 0;
                  do {
                    puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                    if (puVar4 <= puVar23) {
                      puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xc);
                      puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                      goto LAB_0018ff53;
                    }
                    uVar22 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xc);
                    uVar21 = *puVar23;
                    lVar35 = lVar35 + 8;
                  } while (uVar22 == uVar21);
                  uVar21 = uVar21 ^ uVar22;
                  uVar22 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar35;
                }
                else {
                  uVar21 = *puVar1 ^ *puVar30;
                  uVar22 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0018ff53:
                if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar30 = (ulong *)((long)puVar30 + 4);
                }
                if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar30 = (ulong *)((long)puVar30 + 2);
                }
                if (puVar23 < puVar2) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
                }
                uVar22 = (long)puVar23 - (long)puVar1;
              }
              pUVar10[(ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
                   (int)plVar28 - iVar34;
              *(long *)seqStore->lit = *plVar28;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < uVar22 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(uVar22 + 1);
              seqStore->sequences = psVar16 + 1;
              plVar28 = (long *)((long)plVar28 + uVar22 + 4);
              uVar22 = uVar25;
              uVar25 = uVar14;
              src = plVar28;
            } while (plVar28 <= plVar36);
          }
        }
        uVar13 = (uint)uVar22;
        uVar26 = (uint)uVar25;
      } while (plVar28 < plVar36);
    }
  }
  else if (plVar28 < plVar36) {
    bVar17 = 0x20 - cVar12;
    puVar4 = (ulong *)((long)puVar2 - 7);
    puVar5 = (ulong *)((long)puVar2 - 3);
    puVar6 = (ulong *)((long)puVar2 - 1);
    do {
      uVar13 = (uint)((int)*plVar28 * -0x61c8864f) >> (bVar17 & 0x1f);
      uVar14 = (long)plVar28 - (long)pBVar11;
      uVar27 = pUVar10[uVar13];
      uVar21 = (ulong)uVar27;
      UVar20 = (U32)uVar14;
      pUVar10[uVar13] = UVar20;
      if (((int)uVar25 == 0) ||
         (plVar31 = (long *)((long)plVar28 + 1),
         *(int *)((long)plVar31 - uVar25) != *(int *)((long)plVar28 + 1))) {
        if ((uVar7 < uVar27) && (piVar3 = (int *)(pBVar11 + uVar21), *piVar3 == (int)*plVar28)) {
          puVar1 = (ulong *)((long)plVar28 + 4);
          puVar23 = (ulong *)(piVar3 + 1);
          puVar30 = puVar1;
          if (puVar1 < puVar4) {
            if (*puVar23 == *puVar1) {
              lVar33 = 0;
              do {
                puVar23 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                if (puVar4 <= puVar23) {
                  puVar23 = (ulong *)(pBVar11 + lVar33 + uVar21 + 0xc);
                  puVar30 = (ulong *)((long)plVar28 + lVar33 + 0xc);
                  goto LAB_001911b9;
                }
                lVar35 = lVar33 + uVar21 + 0xc;
                uVar22 = *puVar23;
                lVar33 = lVar33 + 8;
              } while (*(ulong *)(pBVar11 + lVar35) == uVar22);
              uVar22 = uVar22 ^ *(ulong *)(pBVar11 + lVar35);
              uVar29 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              uVar22 = (uVar29 >> 3 & 0x1fffffff) + lVar33;
            }
            else {
              uVar29 = *puVar1 ^ *puVar23;
              uVar22 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar22 = uVar22 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001911b9:
            if ((puVar30 < puVar5) && ((int)*puVar23 == (int)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar30 < puVar6) && ((short)*puVar23 == (short)*puVar30)) {
              puVar30 = (ulong *)((long)puVar30 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar30 < puVar2) {
              puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar23 == (char)*puVar30));
            }
            uVar22 = (long)puVar30 - (long)puVar1;
          }
          lVar33 = uVar22 + 4;
          plVar31 = plVar28;
          if (src < plVar28) {
            pBVar15 = pBVar11 + (uVar21 - 1);
            do {
              plVar24 = (long *)((long)plVar31 + -1);
              if ((*(BYTE *)plVar24 != *pBVar15) ||
                 (lVar33 = lVar33 + 1, plVar31 = plVar24, pBVar15 <= pBVar32)) break;
              pBVar15 = pBVar15 + -1;
            } while (src < plVar24);
          }
          uVar27 = (int)plVar28 - (int)piVar3;
          uVar22 = (long)plVar31 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar28 = (long *)((long)plVar24 + uVar22);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar28);
          seqStore->lit = seqStore->lit + uVar22;
          if (uVar22 < 0x10000) {
            psVar16 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar16 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar21 = lVar33 - 3;
          psVar16->litLength = (U16)uVar22;
          psVar16->offset = uVar27 + 3;
          uVar22 = uVar25;
          uVar25 = (ulong)uVar27;
          goto joined_r0x001912bb;
        }
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar19);
      }
      else {
        lVar33 = -uVar25;
        puVar1 = (ulong *)((long)plVar28 + 5);
        puVar30 = (ulong *)((long)plVar28 + lVar33 + 5);
        puVar23 = puVar1;
        if (puVar1 < puVar4) {
          if (*puVar30 == *puVar1) {
            lVar35 = 0;
            do {
              puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
              if (puVar4 <= puVar23) {
                puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xd);
                puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xd);
                goto LAB_00190ed1;
              }
              uVar21 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xd);
              uVar29 = *puVar23;
              lVar35 = lVar35 + 8;
            } while (uVar21 == uVar29);
            uVar29 = uVar29 ^ uVar21;
            uVar21 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar35;
          }
          else {
            uVar29 = *puVar1 ^ *puVar30;
            uVar21 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = uVar21 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00190ed1:
          if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar30 = (ulong *)((long)puVar30 + 4);
          }
          if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar30 = (ulong *)((long)puVar30 + 2);
          }
          if (puVar23 < puVar2) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
          }
          uVar21 = (long)puVar23 - (long)puVar1;
        }
        uVar29 = (long)plVar31 - (long)src;
        plVar24 = (long *)seqStore->lit;
        plVar28 = (long *)((long)plVar24 + uVar29);
        do {
          *plVar24 = *src;
          plVar24 = plVar24 + 1;
          src = (void *)((long)src + 8);
        } while (plVar24 < plVar28);
        seqStore->lit = seqStore->lit + uVar29;
        if (uVar29 < 0x10000) {
          psVar16 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar16 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar33 = uVar21 + 4;
        uVar21 = uVar21 + 1;
        psVar16->litLength = (U16)uVar29;
        psVar16->offset = 1;
joined_r0x001912bb:
        if (0xffff < uVar21) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(lVar33 + (long)plVar31);
        psVar16->matchLength = (U16)uVar21;
        seqStore->sequences = psVar16 + 1;
        src = plVar28;
        if (plVar28 <= plVar36) {
          pUVar10[(uint)(*(int *)(pBVar11 + (uVar14 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar17 & 0x1f)] = UVar20 + 2;
          pUVar10[(uint)(*(int *)((long)plVar28 + -2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               ((int)plVar28 + -2) - iVar34;
          do {
            uVar14 = uVar22;
            uVar22 = uVar14;
            src = plVar28;
            if (((int)uVar14 == 0) || ((int)*plVar28 != *(int *)((long)plVar28 - uVar14))) break;
            lVar33 = -uVar14;
            puVar1 = (ulong *)((long)plVar28 + 4);
            puVar30 = (ulong *)((long)plVar28 + lVar33 + 4);
            puVar23 = puVar1;
            if (puVar1 < puVar4) {
              if (*puVar30 == *puVar1) {
                lVar35 = 0;
                do {
                  puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                  if (puVar4 <= puVar23) {
                    puVar30 = (ulong *)((long)plVar28 + lVar33 + lVar35 + 0xc);
                    puVar23 = (ulong *)((long)plVar28 + lVar35 + 0xc);
                    goto LAB_001910b5;
                  }
                  uVar22 = *(ulong *)((long)plVar28 + lVar35 + lVar33 + 0xc);
                  uVar21 = *puVar23;
                  lVar35 = lVar35 + 8;
                } while (uVar22 == uVar21);
                uVar21 = uVar21 ^ uVar22;
                uVar22 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar35;
              }
              else {
                uVar21 = *puVar1 ^ *puVar30;
                uVar22 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001910b5:
              if ((puVar23 < puVar5) && ((int)*puVar30 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar30 = (ulong *)((long)puVar30 + 4);
              }
              if ((puVar23 < puVar6) && ((short)*puVar30 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar30 = (ulong *)((long)puVar30 + 2);
              }
              if (puVar23 < puVar2) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar30 == (char)*puVar23));
              }
              uVar22 = (long)puVar23 - (long)puVar1;
            }
            pUVar10[(uint)((int)*plVar28 * -0x61c8864f) >> (bVar17 & 0x1f)] = (int)plVar28 - iVar34;
            *(long *)seqStore->lit = *plVar28;
            psVar16 = seqStore->sequences;
            psVar16->litLength = 0;
            psVar16->offset = 1;
            if (0xffff < uVar22 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar16->matchLength = (U16)(uVar22 + 1);
            seqStore->sequences = psVar16 + 1;
            plVar28 = (long *)((long)plVar28 + uVar22 + 4);
            uVar22 = uVar25;
            uVar25 = uVar14;
            src = plVar28;
          } while (plVar28 <= plVar36);
        }
      }
      uVar13 = (uint)uVar22;
      uVar26 = (uint)uVar25;
    } while (plVar28 < plVar36);
  }
  uVar27 = 0;
  if (uVar18 < uVar8) {
    uVar27 = uVar8;
  }
  if (uVar18 < uVar9) {
    uVar27 = uVar9;
  }
  if (uVar26 == 0) {
    uVar26 = uVar27;
  }
  if (uVar13 != 0) {
    uVar27 = uVar13;
  }
  *rep = uVar26;
  rep[1] = uVar27;
  return (long)puVar2 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    U32 const hlog = cParams->hashLog;
    U32 const mls = cParams->searchLength;
    U32 const stepSize = cParams->targetLength;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 7);
    }
}